

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QPointF roundInDeviceCoordinates(QPointF *p,QTransform *m)

{
  QPointF *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar1;
  QPoint *in_stack_ffffffffffffff38;
  QPointF *this;
  QPointF *in_stack_ffffffffffffff50;
  QPointF local_58 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_58;
  QTransform::inverted(in_RDI,(bool *)in_RSI);
  QTransform::map(in_RDI,in_RSI);
  QPointF::toPoint(in_stack_ffffffffffffff50);
  QPointF::QPointF(this,in_stack_ffffffffffffff38);
  QVar1 = QTransform::map(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline QPointF roundInDeviceCoordinates(const QPointF &p, const QTransform &m)
{
    return m.inverted().map(QPointF(m.map(p).toPoint()));
}